

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeThrow<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  Name *pNVar1;
  bool bVar2;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> tag;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
  tagidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)__return_storage_ptr___00,ctx);
  Result<wasm::Name>::Result
            ((Result<wasm::Name> *)local_78,(Result<wasm::Name> *)__return_storage_ptr___00);
  local_90 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_78);
  bVar2 = local_90 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::Name>::~Result((Result<wasm::Name> *)local_78);
  if (bVar2) {
    pNVar1 = Result<wasm::Name>::operator*
                       ((Result<wasm::Name> *)
                        ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    ParseDefsCtx::makeThrow
              (__return_storage_ptr__,ctx,pos,annotations,(Name)(pNVar1->super_IString).str);
  }
  Result<wasm::Name>::~Result
            ((Result<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeThrow(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto tag = tagidx(ctx);
  CHECK_ERR(tag);
  return ctx.makeThrow(pos, annotations, *tag);
}